

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O0

void __thiscall
PCCompatible::IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::out<unsigned_char>
          (IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this,uint16_t port,
          uchar value)

{
  undefined7 in_register_00000011;
  char *pcVar1;
  uchar value_local;
  uint16_t port_local;
  IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this_local;
  
  switch(port) {
  case 0:
    i8237::write<0>(&this->dma_->controller,value);
    break;
  case 1:
    i8237::write<1>(&this->dma_->controller,value);
    break;
  case 2:
    i8237::write<2>(&this->dma_->controller,value);
    break;
  case 3:
    i8237::write<3>(&this->dma_->controller,value);
    break;
  case 4:
    i8237::write<4>(&this->dma_->controller,value);
    break;
  case 5:
    i8237::write<5>(&this->dma_->controller,value);
    break;
  case 6:
    i8237::write<6>(&this->dma_->controller,value);
    break;
  case 7:
    i8237::write<7>(&this->dma_->controller,value);
    break;
  case 8:
    i8237::write<8>(&this->dma_->controller,value);
    break;
  case 9:
    i8237::write<9>(&this->dma_->controller,value);
    break;
  case 10:
    i8237::write<10>(&this->dma_->controller,value);
    break;
  case 0xb:
    i8237::write<11>(&this->dma_->controller,value);
    break;
  case 0xc:
    i8237::write<12>(&this->dma_->controller,value);
    break;
  case 0xd:
    i8237::write<13>(&this->dma_->controller,value);
    break;
  case 0xe:
    i8237::write<14>(&this->dma_->controller,value);
    break;
  case 0xf:
    i8237::write<15>(&this->dma_->controller,value);
    break;
  default:
    printf("Unhandled out: %02x to %04x\n",(ulong)value,(ulong)port);
    break;
  case 0x20:
    PIC::write<0>(this->pic_,value);
    break;
  case 0x21:
    PIC::write<1>(this->pic_,value);
    break;
  case 0x40:
    i8253<false,_PCCompatible::PITObserver>::write<0>(this->pit_,value);
    break;
  case 0x41:
    i8253<false,_PCCompatible::PITObserver>::write<1>(this->pit_,value);
    break;
  case 0x42:
    i8253<false,_PCCompatible::PITObserver>::write<2>(this->pit_,value);
    break;
  case 0x43:
    i8253<false,_PCCompatible::PITObserver>::set_mode(this->pit_,value);
    break;
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
    Intel::i8255::i8255<PCCompatible::i8255PortHandler>::write
              (this->ppi_,(uint)port,(void *)(ulong)value,0xa5b584);
    break;
  case 0x70:
    RTC::write<0>(this->rtc_,value);
    break;
  case 0x71:
    RTC::write<1>(this->rtc_,value);
    break;
  case 0x80:
    DMAPages::set_page<0>(&this->dma_->pages,value);
    break;
  case 0x81:
    DMAPages::set_page<1>(&this->dma_->pages,value);
    break;
  case 0x82:
    DMAPages::set_page<2>(&this->dma_->pages,value);
    break;
  case 0x83:
    DMAPages::set_page<3>(&this->dma_->pages,value);
    break;
  case 0x84:
    DMAPages::set_page<4>(&this->dma_->pages,value);
    break;
  case 0x85:
    DMAPages::set_page<5>(&this->dma_->pages,value);
    break;
  case 0x86:
    DMAPages::set_page<6>(&this->dma_->pages,value);
    break;
  case 0x87:
    DMAPages::set_page<7>(&this->dma_->pages,value);
    break;
  case 0xa0:
    pcVar1 = "unmasked";
    if ((value & 0x80) != 0) {
      pcVar1 = "masked";
    }
    printf("TODO: NMIs %s\n",pcVar1);
    break;
  case 0x278:
  case 0x279:
  case 0x27a:
  case 0x378:
  case 0x379:
  case 0x37a:
  case 0x3bc:
  case 0x3bd:
  case 0x3be:
    break;
  case 0x2e8:
  case 0x2e9:
  case 0x2ea:
  case 0x2eb:
  case 0x2ec:
  case 0x2ed:
  case 0x2ee:
  case 0x2ef:
  case 0x2f8:
  case 0x2f9:
  case 0x2fa:
  case 0x2fb:
  case 0x2fc:
  case 0x2fd:
  case 0x2fe:
  case 0x2ff:
  case 1000:
  case 0x3e9:
  case 0x3ea:
  case 0x3eb:
  case 0x3ec:
  case 0x3ed:
  case 0x3ee:
  case 0x3ef:
  case 0x3f8:
  case 0x3f9:
  case 0x3fa:
  case 0x3fb:
  case 0x3fc:
  case 0x3fd:
  case 0x3fe:
  case 0x3ff:
    break;
  case 0x3b0:
  case 0x3b2:
  case 0x3b4:
  case 0x3b6:
    MDA::write<0>(this->video_,value);
    break;
  case 0x3b1:
  case 0x3b3:
  case 0x3b5:
  case 0x3b7:
    MDA::write<1>(this->video_,value);
    break;
  case 0x3b8:
    MDA::write<8>(this->video_,value);
    break;
  case 0x3b9:
    MDA::write<9>(this->video_,value);
    break;
  case 0x3f2:
    FloppyController::set_digital_output(this->fdc_,value);
    break;
  case 0x3f4:
    printf("TODO: FDC write of %02x at %04x\n",(ulong)value,(ulong)port);
    break;
  case 0x3f5:
    FloppyController::write
              (this->fdc_,(uint)value,(void *)CONCAT71(in_register_00000011,value),0xa5b584);
  }
  return;
}

Assistant:

void out(uint16_t port, IntT value) {
			static constexpr uint16_t crtc_base =
				video == Target::VideoAdaptor::MDA ? 0x03b0 : 0x03d0;

			switch(port) {
				default:
					if constexpr (std::is_same_v<IntT, uint8_t>) {
						printf("Unhandled out: %02x to %04x\n", value, port);
					} else {
						printf("Unhandled out: %04x to %04x\n", value, port);
					}
				break;

				case 0x0070:	rtc_.write<0>(uint8_t(value));	break;
				case 0x0071:	rtc_.write<1>(uint8_t(value));	break;

				// On the XT the NMI can be masked by setting bit 7 on I/O port 0xA0.
				case 0x00a0:
					printf("TODO: NMIs %s\n", (value & 0x80) ? "masked" : "unmasked");
				break;

				case 0x0000:	dma_.controller.write<0x0>(uint8_t(value));		break;
				case 0x0001:	dma_.controller.write<0x1>(uint8_t(value));		break;
				case 0x0002:	dma_.controller.write<0x2>(uint8_t(value));		break;
				case 0x0003:	dma_.controller.write<0x3>(uint8_t(value));		break;
				case 0x0004:	dma_.controller.write<0x4>(uint8_t(value));		break;
				case 0x0005:	dma_.controller.write<0x5>(uint8_t(value));		break;
				case 0x0006:	dma_.controller.write<0x6>(uint8_t(value));		break;
				case 0x0007:	dma_.controller.write<0x7>(uint8_t(value));		break;
				case 0x0008:	dma_.controller.write<0x8>(uint8_t(value));		break;
				case 0x0009:	dma_.controller.write<0x9>(uint8_t(value));		break;
				case 0x000a:	dma_.controller.write<0xa>(uint8_t(value));		break;
				case 0x000b:	dma_.controller.write<0xb>(uint8_t(value));		break;
				case 0x000c:	dma_.controller.write<0xc>(uint8_t(value));		break;
				case 0x000d:	dma_.controller.write<0xd>(uint8_t(value));		break;
				case 0x000e:	dma_.controller.write<0xe>(uint8_t(value));		break;
				case 0x000f:	dma_.controller.write<0xf>(uint8_t(value));		break;

				case 0x0020:	pic_.write<0>(uint8_t(value));	break;
				case 0x0021:	pic_.write<1>(uint8_t(value));	break;

				case 0x0040:	pit_.write<0>(uint8_t(value));	break;
				case 0x0041:	pit_.write<1>(uint8_t(value));	break;
				case 0x0042:	pit_.write<2>(uint8_t(value));	break;
				case 0x0043:	pit_.set_mode(uint8_t(value));	break;

				case 0x0060:	case 0x0061:	case 0x0062:	case 0x0063:
				case 0x0064:	case 0x0065:	case 0x0066:	case 0x0067:
				case 0x0068:	case 0x0069:	case 0x006a:	case 0x006b:
				case 0x006c:	case 0x006d:	case 0x006e:	case 0x006f:
					ppi_.write(port, uint8_t(value));
				break;

				case 0x0080:	dma_.pages.set_page<0>(uint8_t(value));	break;
				case 0x0081:	dma_.pages.set_page<1>(uint8_t(value));	break;
				case 0x0082:	dma_.pages.set_page<2>(uint8_t(value));	break;
				case 0x0083:	dma_.pages.set_page<3>(uint8_t(value));	break;
				case 0x0084:	dma_.pages.set_page<4>(uint8_t(value));	break;
				case 0x0085:	dma_.pages.set_page<5>(uint8_t(value));	break;
				case 0x0086:	dma_.pages.set_page<6>(uint8_t(value));	break;
				case 0x0087:	dma_.pages.set_page<7>(uint8_t(value));	break;

				//
				// CRTC access block, with slightly laboured 16-bit to 8-bit mapping.
				//
				case crtc_base + 0:		case crtc_base + 2:
				case crtc_base + 4:		case crtc_base + 6:
					if constexpr (std::is_same_v<IntT, uint16_t>) {
						video_.template write<0>(uint8_t(value));
						video_.template write<1>(uint8_t(value >> 8));
					} else {
						video_.template write<0>(value);
					}
				break;
				case crtc_base + 1:		case crtc_base + 3:
				case crtc_base + 5:		case crtc_base + 7:
					if constexpr (std::is_same_v<IntT, uint16_t>) {
						video_.template write<1>(uint8_t(value));
						video_.template write<0>(uint8_t(value >> 8));
					} else {
						video_.template write<1>(value);
					}
				break;

				case crtc_base + 0x8:	video_.template write<0x8>(uint8_t(value));	break;
				case crtc_base + 0x9:	video_.template write<0x9>(uint8_t(value));	break;

				case 0x03f2:
					fdc_.set_digital_output(uint8_t(value));
				break;
				case 0x03f4:
					printf("TODO: FDC write of %02x at %04x\n", value, port);
				break;
				case 0x03f5:
					fdc_.write(uint8_t(value));
				break;

				case 0x0278:	case 0x0279:	case 0x027a:
				case 0x0378:	case 0x0379:	case 0x037a:
				case 0x03bc:	case 0x03bd:	case 0x03be:
					// Ignore parallel port accesses.
				break;

				case 0x02e8:	case 0x02e9:	case 0x02ea:	case 0x02eb:
				case 0x02ec:	case 0x02ed:	case 0x02ee:	case 0x02ef:
				case 0x02f8:	case 0x02f9:	case 0x02fa:	case 0x02fb:
				case 0x02fc:	case 0x02fd:	case 0x02fe:	case 0x02ff:
				case 0x03e8:	case 0x03e9:	case 0x03ea:	case 0x03eb:
				case 0x03ec:	case 0x03ed:	case 0x03ee:	case 0x03ef:
				case 0x03f8:	case 0x03f9:	case 0x03fa:	case 0x03fb:
				case 0x03fc:	case 0x03fd:	case 0x03fe:	case 0x03ff:
					// Ignore serial port accesses.
				break;
			}
		}